

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall pugi::xpath_query::evaluate_boolean(xpath_query *this,xpath_node *n)

{
  bool bVar1;
  xpath_context c;
  xpath_stack_data sd;
  xpath_context local_20a8;
  xpath_memory_block local_2088;
  xpath_memory_block local_1078;
  xpath_allocator local_68;
  xpath_allocator local_50;
  xpath_stack local_38;
  bool local_28 [8];
  
  if ((undefined8 *)this->_impl == (undefined8 *)0x0) {
    bVar1 = false;
  }
  else {
    local_20a8.n._node._root = (n->_node)._root;
    local_20a8.n._attribute._attr = (n->_attribute)._attr;
    local_20a8.position = 1;
    local_20a8.size = 1;
    local_68._error = local_28;
    local_68._root = &local_2088;
    local_68._root_size = 0;
    local_50._root = &local_1078;
    local_50._root_size = 0;
    local_28[0] = false;
    local_1078.next = (xpath_memory_block *)0x0;
    local_2088.next = (xpath_memory_block *)0x0;
    local_1078.capacity = 0x1000;
    local_2088.capacity = 0x1000;
    local_50._error = local_68._error;
    local_38.result = &local_68;
    local_38.temp = &local_50;
    bVar1 = impl::anon_unknown_0::xpath_ast_node::eval_boolean(*this->_impl,&local_20a8,&local_38);
    bVar1 = (bool)((local_28[0] ^ 1U) & bVar1);
    impl::anon_unknown_0::xpath_allocator::release(&local_68);
    impl::anon_unknown_0::xpath_allocator::release(&local_50);
  }
  return bVar1;
}

Assistant:

PUGI_IMPL_FN bool xpath_query::evaluate_boolean(const xpath_node& n) const
	{
		if (!_impl) return false;

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		bool r = static_cast<impl::xpath_query_impl*>(_impl)->root->eval_boolean(c, sd.stack);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return false;
		#else
			throw std::bad_alloc();
		#endif
		}

		return r;
	}